

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O0

Index __thiscall
wasm::anon_unknown_157::TranslateToExnref::getScratchLocal(TranslateToExnref *this,Type type)

{
  Index IVar1;
  type *this_00;
  type_conflict1 *ptVar2;
  Function *func;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>,_bool>
  pVar4;
  type_conflict1 *inserted;
  type *it;
  int local_3c;
  pair<const_wasm::Type,_unsigned_int> local_38;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>,_bool>
  local_28;
  TranslateToExnref *local_18;
  TranslateToExnref *this_local;
  Type type_local;
  
  local_3c = 0;
  local_18 = this;
  this_local = (TranslateToExnref *)type.id;
  std::pair<const_wasm::Type,_unsigned_int>::pair<wasm::Type_&,_int,_true>
            (&local_38,(Type *)&this_local,&local_3c);
  pVar4 = std::
          unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
          ::insert(&this->typeToScratchLocal,&local_38);
  local_28.first =
       pVar4.first.super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>._M_cur
  ;
  local_28.second = pVar4.second;
  this_00 = std::
            get<0ul,std::__detail::_Node_iterator<std::pair<wasm::Type_const,unsigned_int>,false,true>,bool>
                      (&local_28);
  ptVar2 = std::
           get<1ul,std::__detail::_Node_iterator<std::pair<wasm::Type_const,unsigned_int>,false,true>,bool>
                     (&local_28);
  if ((*ptVar2 & 1U) != 0) {
    func = Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
           ::getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                        );
    IVar1 = Builder::addVar(func,(Type)this_local);
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>::
             operator->(this_00);
    ppVar3->second = IVar1;
  }
  ppVar3 = std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>::
           operator->(this_00);
  return ppVar3->second;
}

Assistant:

Index getScratchLocal(Type type) {
    auto [it, inserted] = typeToScratchLocal.insert({type, 0});
    if (inserted) {
      it->second = Builder::addVar(getFunction(), type);
    }
    return it->second;
  }